

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O0

void __thiscall
jsonip::detail::stl_pushbackable_helper<std::vector<P,_std::allocator<P>_>_>::array_start
          (stl_pushbackable_helper<std::vector<P,_std::allocator<P>_>_> *this,holder *h)

{
  vector<P,_std::allocator<P>_> *this_00;
  holder *h_local;
  stl_pushbackable_helper<std::vector<P,_std::allocator<P>_>_> *this_local;
  
  this_00 = holder::get<std::vector<P,std::allocator<P>>>(h);
  std::vector<P,_std::allocator<P>_>::clear(this_00);
  return;
}

Assistant:

void array_start(holder& h) const { h.get<T>().clear(); }